

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftadvanc.c
# Opt level: O2

FT_Error FT_Get_Advance(FT_Face face,FT_UInt gindex,FT_Int32 flags,FT_Fixed *padvance)

{
  FT_Face_GetAdvancesFunc p_Var1;
  FT_Error FVar2;
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else if (padvance == (FT_Fixed *)0x0) {
    FVar2 = 6;
  }
  else {
    if (gindex < (uint)face->num_glyphs) {
      p_Var1 = face->driver->clazz->get_advances;
      if ((p_Var1 != (FT_Face_GetAdvancesFunc)0x0) &&
         ((flags & 3U) != 0 || (flags & 0xf0000U) == 0x10000)) {
        FVar2 = (*p_Var1)(face,gindex,1,flags,padvance);
        if (FVar2 == 0) {
          FVar2 = _ft_face_scale_advances(face,padvance,1,flags);
          return FVar2;
        }
        if ((char)FVar2 != '\a') {
          return FVar2;
        }
      }
      FVar2 = FT_Get_Advances(face,gindex,1,flags,padvance);
      return FVar2;
    }
    FVar2 = 0x10;
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Advance( FT_Face    face,
                  FT_UInt    gindex,
                  FT_Int32   flags,
                  FT_Fixed  *padvance )
  {
    FT_Face_GetAdvancesFunc  func;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !padvance )
      return FT_THROW( Invalid_Argument );

    if ( gindex >= (FT_UInt)face->num_glyphs )
      return FT_THROW( Invalid_Glyph_Index );

    func = face->driver->clazz->get_advances;
    if ( func && LOAD_ADVANCE_FAST_CHECK( face, flags ) )
    {
      FT_Error  error;


      error = func( face, gindex, 1, flags, padvance );
      if ( !error )
        return _ft_face_scale_advances( face, padvance, 1, flags );

      if ( FT_ERR_NEQ( error, Unimplemented_Feature ) )
        return error;
    }

    return FT_Get_Advances( face, gindex, 1, flags, padvance );
  }